

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GestDsk.cpp
# Opt level: O1

void __thiscall DSK::SetInfoDirEntry(DSK *this,int NumDir,StDirEntry *Dir)

{
  uchar *puVar1;
  int track;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  
  uVar12 = 0x100;
  if ((ulong)this->ImgDsk[0x115] != 0) {
    uVar15 = 0;
    do {
      if (this->ImgDsk[uVar15 * 8 + 0x11a] <= uVar12) {
        uVar12 = (uint)this->ImgDsk[uVar15 * 8 + 0x11a];
      }
      uVar15 = uVar15 + 1;
    } while (this->ImgDsk[0x115] != uVar15);
  }
  track = (uint)(uVar12 == 0x41) * 2;
  if (uVar12 == 1) {
    track = 1;
  }
  iVar16 = 0x10;
  do {
    iVar13 = GetPosData(this,track,(NumDir >> 4) + uVar12,true);
    lVar14 = (long)(int)(iVar13 + (NumDir & 0xfU) * 0x20);
    cVar5 = Dir->Nom[0];
    cVar6 = Dir->Nom[1];
    cVar7 = Dir->Nom[2];
    cVar8 = Dir->Nom[3];
    cVar9 = Dir->Nom[4];
    cVar10 = Dir->Nom[5];
    cVar11 = Dir->Nom[6];
    uVar2 = *(undefined8 *)(Dir->Nom + 7);
    uVar3 = *(undefined8 *)Dir->Blocks;
    uVar4 = *(undefined8 *)(Dir->Blocks + 8);
    puVar1 = this->ImgDsk + lVar14;
    puVar1[0] = Dir->User;
    puVar1[1] = cVar5;
    puVar1[2] = cVar6;
    puVar1[3] = cVar7;
    puVar1[4] = cVar8;
    puVar1[5] = cVar9;
    puVar1[6] = cVar10;
    puVar1[7] = cVar11;
    *(undefined8 *)(puVar1 + 8) = uVar2;
    *(undefined8 *)(this->ImgDsk + lVar14 + 0x10) = uVar3;
    *(undefined8 *)(this->ImgDsk + lVar14 + 0x10 + 8) = uVar4;
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  return;
}

Assistant:

void DSK::SetInfoDirEntry( int NumDir, StDirEntry * Dir ) {
    int MinSect = GetMinSect();
    int s = ( NumDir >> 4 ) + MinSect;
    int t = ( MinSect == 0x41 ? 2 : 0 );
    if ( MinSect == 1 )
        t = 1;
	
    for (int i =0; i<16; i++) 
		memcpy( &ImgDsk[ ( ( NumDir & 15 ) << 5 ) + GetPosData( t, s, true ) ]
				, Dir
				, sizeof( StDirEntry )
				);
}